

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_allocator.cpp
# Opt level: O3

void __thiscall
duckdb::TupleDataAllocator::ReleaseOrStoreHandles
          (TupleDataAllocator *this,TupleDataPinState *pin_state,TupleDataSegment *segment,
          TupleDataChunk *chunk,bool release_heap)

{
  undefined7 in_register_00000081;
  
  ReleaseOrStoreHandlesInternal
            (segment,&segment->pinned_row_handles,&pin_state->row_handles,&chunk->row_block_ids,
             &this->row_blocks,pin_state->properties);
  if (((int)CONCAT71(in_register_00000081,release_heap) != 0) &&
     (this->layout->all_constant == false)) {
    ReleaseOrStoreHandlesInternal
              (segment,&segment->pinned_heap_handles,&pin_state->heap_handles,&chunk->heap_block_ids
               ,&this->heap_blocks,pin_state->properties);
    return;
  }
  return;
}

Assistant:

void TupleDataAllocator::ReleaseOrStoreHandles(TupleDataPinState &pin_state, TupleDataSegment &segment,
                                               TupleDataChunk &chunk, bool release_heap) {
	D_ASSERT(this == segment.allocator.get());
	ReleaseOrStoreHandlesInternal(segment, segment.pinned_row_handles, pin_state.row_handles, chunk.row_block_ids,
	                              row_blocks, pin_state.properties);
	if (!layout.AllConstant() && release_heap) {
		ReleaseOrStoreHandlesInternal(segment, segment.pinned_heap_handles, pin_state.heap_handles,
		                              chunk.heap_block_ids, heap_blocks, pin_state.properties);
	}
}